

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanSyncObjectManager.cpp
# Opt level: O0

void __thiscall
VulkanUtilities::VulkanSyncObjectManager::Recycle
          (VulkanSyncObjectManager *this,VkSemaphoreType vkSem,bool IsUnsignaled)

{
  PFN_vkDestroySemaphore p_Var1;
  VkDevice pVVar2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> Lock;
  bool IsUnsignaled_local;
  VulkanSyncObjectManager *this_local;
  VkSemaphoreType vkSem_local;
  
  p_Var1 = vkDestroySemaphore;
  Lock._M_device._7_1_ = IsUnsignaled;
  this_local = (VulkanSyncObjectManager *)vkSem.Value;
  if (IsUnsignaled) {
    std::lock_guard<std::mutex>::lock_guard(&local_28,&this->m_SemaphorePoolGuard);
    std::vector<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>::push_back
              (&this->m_SemaphorePool,(value_type *)&this_local);
    std::lock_guard<std::mutex>::~lock_guard(&local_28);
  }
  else {
    pVVar2 = VulkanLogicalDevice::GetVkDevice(this->m_LogicalDevice);
    (*p_Var1)(pVVar2,(VkSemaphore)this_local,(VkAllocationCallbacks *)0x0);
  }
  return;
}

Assistant:

void VulkanSyncObjectManager::Recycle(VkSemaphoreType vkSem, bool IsUnsignaled)
{
    // Can not reuse semaphore in signaled state
    if (!IsUnsignaled)
    {
        vkDestroySemaphore(m_LogicalDevice.GetVkDevice(), vkSem.Value, nullptr);
        return;
    }

    std::lock_guard<std::mutex> Lock{m_SemaphorePoolGuard};
    m_SemaphorePool.push_back(vkSem.Value);
}